

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utAssbinImportExport.cpp
# Opt level: O3

bool __thiscall utAssbinImportExport::importerTest(utAssbinImportExport *this)

{
  bool bVar1;
  aiScene *paVar2;
  char *message;
  Exporter exporter;
  Importer importer;
  AssertionResult gtest_ar;
  Message local_38;
  AssertHelper local_30;
  Exporter local_28;
  Importer local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  Assimp::Importer::Importer(&local_20);
  paVar2 = Assimp::Importer::ReadFile
                     (&local_20,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider.obj"
                      ,0x400);
  Assimp::Exporter::Exporter(&local_28);
  local_38.ss_.ptr_._0_4_ = 0;
  local_30.data_._0_4_ =
       Assimp::Exporter::Export
                 (&local_28,paVar2,"assbin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider_out.assbin"
                  ,0,(ExportProperties *)0x0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_18,"aiReturn_SUCCESS",
             "exporter.Export( scene, \"assbin\", \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/OBJ/spider_out.assbin\" )"
             ,(aiReturn *)&local_38,(aiReturn *)&local_30);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utAssbinImportExport.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,local_38.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = Assimp::Importer::ReadFile
                     (&local_20,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/spider_out.assbin"
                      ,0x400);
  Assimp::Exporter::~Exporter(&local_28);
  Assimp::Importer::~Importer(&local_20);
  return paVar2 != (aiScene *)0x0;
}

Assistant:

bool importerTest() override {
        Importer importer;
        const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider.obj", aiProcess_ValidateDataStructure );

        Exporter exporter;
        EXPECT_EQ( aiReturn_SUCCESS, exporter.Export( scene, "assbin", ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin" ) );
        const aiScene *newScene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/spider_out.assbin", aiProcess_ValidateDataStructure );

        return newScene != nullptr;
    }